

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  size_t sVar3;
  int iVar4;
  sbyte sVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  size_t i;
  ulong uVar9;
  HuffmanTree *pHVar10;
  HuffmanTree *pHVar11;
  HuffmanTree *bitlen;
  byte bVar12;
  uint uVar13;
  uint *puVar14;
  HuffmanTree *pHVar15;
  int iVar16;
  ulong size;
  uint uVar17;
  long lVar18;
  long lVar19;
  uchar *src;
  uint *puVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  LodePNGBitReader local_128;
  uint local_100;
  uint local_fc;
  ucvector *local_f8;
  HuffmanTree *local_f0;
  uint local_e4;
  long local_e0;
  ulong local_d8;
  LodePNGDecompressSettings *local_d0;
  uint local_c4;
  size_t local_c0;
  HuffmanTree tree_ll;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  local_128.bitsize = insize * 8;
  if (local_128.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_128.bp = 0;
    local_128.buffer = 0;
    uVar17 = 0;
    local_128.data = in;
    local_128.size = insize;
    local_f8 = out;
    local_d0 = settings;
    do {
      if (uVar17 != 0) {
        return 0;
      }
      if (local_128.bitsize - local_128.bp < 3) {
        return 0x34;
      }
      ensureBits9(&local_128,(size_t)in);
      sVar3 = local_128.bp;
      sVar22 = local_128.size;
      puVar1 = local_128.data;
      uVar23 = local_128.bp + 3;
      uVar17 = local_128.buffer >> 1 & 3;
      local_fc = local_128.buffer;
      if (uVar17 == 0) {
        uVar9 = local_128.bp + 10 >> 3;
        uVar21 = uVar9 + 4;
        if (local_128.size <= uVar21) {
          return 0x34;
        }
        uVar2 = *(ushort *)(local_128.data + uVar9);
        size = (ulong)uVar2;
        if ((local_d0->ignore_nlen == 0) &&
           ((uint)*(ushort *)(local_128.data + uVar9 + 2) + (uint)uVar2 != 0xffff)) {
          return 0x15;
        }
        in = (uchar *)(out->size + size);
        local_128.bp = uVar23;
        local_128.buffer = local_128.buffer >> 3;
        uVar17 = ucvector_resize(out,(size_t)in);
        if (uVar17 == 0) {
          return 0x53;
        }
        if (sVar22 < uVar21 + size) {
          return 0x17;
        }
        if (uVar2 != 0) {
          in = puVar1 + uVar21;
          lodepng_memcpy(local_f8->data + (local_f8->size - size),in,size);
          uVar21 = uVar21 + size;
        }
        local_128.bp = uVar21 << 3;
        out = local_f8;
      }
      else {
        if (uVar17 == 3) {
          return 0x14;
        }
        sVar22 = local_d0->max_output_size;
        in = (uchar *)(out->size + 0x104);
        local_128.bp = uVar23;
        local_128.buffer = local_128.buffer >> 3;
        uVar7 = ucvector_reserve(out,(size_t)in);
        sVar6 = local_128.bitsize;
        if (uVar7 == 0) {
          return 0x53;
        }
        tree_ll.codes = (uint *)0x0;
        tree_ll.lengths = (uint *)0x0;
        tree_ll.table_len = (uchar *)0x0;
        tree_ll.table_value = (unsigned_short *)0x0;
        local_88.codes = (uint *)0x0;
        local_88.lengths = (uint *)0x0;
        local_88.table_len = (uchar *)0x0;
        local_88.table_value = (unsigned_short *)0x0;
        if (uVar17 == 1) {
          uVar17 = generateFixedLitLenTree(&tree_ll);
          if (uVar17 == 0) {
            uVar17 = generateFixedDistanceTree(&local_88);
            goto LAB_001b3ee1;
          }
        }
        else {
          uVar17 = 0x31;
          out = local_f8;
          local_c0 = sVar22;
          if (local_128.bitsize - uVar23 < 0xe) goto LAB_001b3ee1;
          uVar9 = uVar23 >> 3;
          uVar21 = uVar9 + 2;
          if (uVar21 < local_128.size) {
            uVar7 = (uint)*(ushort *)(local_128.data + uVar9);
            sVar5 = 0x10;
LAB_001b3d7f:
            uVar7 = uVar7 + ((uint)local_128.data[uVar21] << sVar5);
          }
          else {
            uVar7 = 0;
            if (uVar9 < local_128.size) {
              uVar7 = (uint)local_128.data[uVar9];
            }
            uVar21 = uVar9 + 1;
            if (uVar21 < local_128.size) {
              sVar5 = 8;
              goto LAB_001b3d7f;
            }
          }
          uVar7 = uVar7 >> ((byte)uVar23 & 7);
          local_128.buffer = uVar7 >> 0xe;
          uVar23 = sVar3 + 0x11;
          local_128.bp = uVar23;
          pHVar10 = (HuffmanTree *)malloc(0x4c);
          uVar17 = 0x53;
          out = local_f8;
          sVar22 = local_c0;
          if (pHVar10 == (HuffmanTree *)0x0) goto LAB_001b3ee1;
          uVar17 = uVar7 >> 10 & 0xf;
          uVar9 = (ulong)uVar17;
          local_58.codes = (uint *)0x0;
          local_58.lengths = (uint *)0x0;
          local_58.table_len = (uchar *)0x0;
          local_58.table_value = (unsigned_short *)0x0;
          uVar21 = (uVar17 + 4) * 3 + uVar23;
          if (sVar6 < uVar21 || uVar21 < uVar23) {
            uVar17 = 0x32;
LAB_001b3ea2:
            bitlen = (HuffmanTree *)0x0;
            pHVar11 = (HuffmanTree *)0x0;
          }
          else {
            local_d8 = (ulong)(uVar7 & 0x1f);
            local_e4 = (uVar7 & 0x1f) + 0x101;
            for (lVar19 = 0; uVar9 * 4 + 0x10 != lVar19; lVar19 = lVar19 + 4) {
              ensureBits9(&local_128,(size_t)in);
              local_128.bp = local_128.bp + 3;
              *(uint *)((long)&pHVar10->codes + (ulong)*(uint *)((long)CLCL_ORDER + lVar19) * 4) =
                   local_128.buffer & 7;
              local_128.buffer = local_128.buffer >> 3;
            }
            for (; uVar9 != 0xf; uVar9 = uVar9 + 1) {
              *(undefined4 *)((long)&pHVar10->codes + (ulong)CLCL_ORDER[uVar9 + 4] * 4) = 0;
            }
            in = (uchar *)pHVar10;
            uVar17 = HuffmanTree_makeFromLengths(&local_58,(uint *)pHVar10,0x13,7);
            if (uVar17 != 0) goto LAB_001b3ea2;
            pHVar11 = (HuffmanTree *)malloc(0x480);
            bitlen = (HuffmanTree *)malloc(0x80);
            if (bitlen == (HuffmanTree *)0x0 || pHVar11 == (HuffmanTree *)0x0) {
              uVar17 = 0x53;
            }
            else {
              for (lVar19 = 0; lVar19 != 0x480; lVar19 = lVar19 + 1) {
                *(undefined1 *)((long)&pHVar11->codes + lVar19) = 0;
              }
              for (lVar19 = 0; lVar19 != 0x80; lVar19 = lVar19 + 1) {
                *(undefined1 *)((long)&bitlen->codes + lVar19) = 0;
              }
              uVar7 = (uVar7 >> 5 & 0x1f) + 1 + local_e4;
              uVar21 = (ulong)uVar7;
              local_c4 = (int)local_d8 + 0x102;
              uVar9 = (ulong)local_e4;
              uVar17 = -(int)local_d8;
              local_d8 = (ulong)uVar17;
              local_e0 = (long)(int)uVar17 + -0x101;
              local_100 = 0;
              uVar23 = 0;
              local_f0 = pHVar11;
              do {
                uVar17 = (uint)uVar23;
                if (uVar7 <= uVar17) {
                  pHVar11 = local_f0;
                  uVar17 = local_100;
                  if (local_100 == 0) {
                    if (*(int *)&local_f0[0x19].table_len == 0) {
                      uVar17 = 0x40;
                    }
                    else {
                      in = (uchar *)local_f0;
                      uVar17 = HuffmanTree_makeFromLengths(&tree_ll,(uint *)local_f0,0x120,0xf);
                      pHVar11 = local_f0;
                      if (uVar17 == 0) {
                        in = (uchar *)bitlen;
                        uVar17 = HuffmanTree_makeFromLengths(&local_88,(uint *)bitlen,0x20,0xf);
                        pHVar11 = local_f0;
                      }
                    }
                  }
                  goto LAB_001b3ea7;
                }
                ensureBits25(&local_128,(size_t)in);
                in = (uchar *)&local_58;
                uVar8 = huffmanDecodeSymbol(&local_128,(HuffmanTree *)in);
                pHVar11 = local_f0;
                if (uVar8 < 0x10) {
                  pHVar15 = bitlen;
                  uVar13 = local_e4;
                  if (uVar17 < local_e4) {
                    uVar13 = 0;
                    pHVar15 = local_f0;
                  }
                  in = (uchar *)(ulong)(uVar17 - uVar13);
                  *(uint *)((long)&pHVar15->codes + (long)in * 4) = uVar8;
                  uVar23 = (ulong)(uVar17 + 1);
                }
                else {
                  uVar23 = uVar23 & 0xffffffff;
                  iVar4 = (int)local_e0;
                  if (uVar8 == 0x12) {
                    uVar17 = local_128.buffer & 0x7f;
                    local_128.buffer = local_128.buffer >> 7;
                    local_128.bp = local_128.bp + 7;
                    iVar16 = uVar17 + 0xb;
                    in = (uchar *)((long)&local_f0->codes + uVar23 * 4);
                    while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
                      if (uVar21 == uVar23) {
                        local_100 = 0xf;
                        break;
                      }
                      pHVar15 = (HuffmanTree *)
                                ((long)&bitlen->codes + (ulong)(uint)(iVar4 + (int)uVar23) * 4);
                      if (uVar23 < uVar9) {
                        pHVar15 = (HuffmanTree *)in;
                      }
                      *(undefined4 *)&pHVar15->codes = 0;
                      uVar23 = uVar23 + 1;
                      in = (uchar *)((long)&((HuffmanTree *)in)->codes + 4);
                    }
                  }
                  else if (uVar8 == 0x11) {
                    uVar17 = local_128.buffer & 7;
                    local_128.buffer = local_128.buffer >> 3;
                    local_128.bp = local_128.bp + 3;
                    iVar16 = uVar17 + 3;
                    in = (uchar *)((long)&local_f0->codes + uVar23 * 4);
                    while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
                      if (uVar21 == uVar23) {
                        local_100 = 0xe;
                        break;
                      }
                      pHVar15 = (HuffmanTree *)
                                ((long)&bitlen->codes + (ulong)(uint)(iVar4 + (int)uVar23) * 4);
                      if (uVar23 < uVar9) {
                        pHVar15 = (HuffmanTree *)in;
                      }
                      *(undefined4 *)&pHVar15->codes = 0;
                      uVar23 = uVar23 + 1;
                      in = (uchar *)((long)&((HuffmanTree *)in)->codes + 4);
                    }
                  }
                  else {
                    if (uVar8 != 0x10) {
                      uVar17 = 0x10;
                      goto LAB_001b3ea7;
                    }
                    if (uVar17 == 0) {
                      uVar17 = 0x36;
                      goto LAB_001b3ea7;
                    }
                    uVar8 = local_128.buffer & 3;
                    local_128.buffer = local_128.buffer >> 2;
                    local_128.bp = local_128.bp + 2;
                    iVar16 = uVar8 + 3;
                    puVar20 = (uint *)((long)&bitlen->codes +
                                      (ulong)((uVar17 - 0x102) + (int)local_d8) * 4);
                    if (uVar17 < local_c4) {
                      puVar20 = (uint *)((long)&local_f0->codes + (ulong)(uVar17 - 1) * 4);
                    }
                    uVar17 = *puVar20;
                    in = (uchar *)(ulong)uVar17;
                    puVar20 = (uint *)((long)&local_f0->codes + uVar23 * 4);
                    while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
                      if (uVar21 == uVar23) {
                        local_100 = 0xd;
                        break;
                      }
                      puVar14 = (uint *)((long)&bitlen->codes +
                                        (ulong)(uint)(iVar4 + (int)uVar23) * 4);
                      if (uVar23 < uVar9) {
                        puVar14 = puVar20;
                      }
                      *puVar14 = uVar17;
                      uVar23 = uVar23 + 1;
                      puVar20 = puVar20 + 1;
                    }
                  }
                }
              } while (local_128.bp <= local_128.bitsize);
              uVar17 = 0x32;
            }
          }
LAB_001b3ea7:
          free(pHVar10);
          free(pHVar11);
          free(bitlen);
          HuffmanTree_cleanup(&local_58);
          out = local_f8;
          sVar22 = local_c0;
LAB_001b3ee1:
          if (uVar17 == 0) {
            bVar25 = false;
            do {
              pHVar10 = &tree_ll;
              uVar17 = 0;
              if (bVar25) goto LAB_001b4131;
              ensureBits32(&local_128,(size_t)in);
              in = (uchar *)pHVar10;
              uVar17 = huffmanDecodeSymbol(&local_128,pHVar10);
              if (uVar17 < 0x100) {
                sVar3 = out->size;
                out->size = sVar3 + 1;
                out->data[sVar3] = (uchar)uVar17;
                uVar17 = huffmanDecodeSymbol(&local_128,pHVar10);
                in = (uchar *)pHVar10;
                if (0xff < uVar17) goto LAB_001b3f53;
                sVar3 = out->size;
                out->size = sVar3 + 1;
                out->data[sVar3] = (uchar)uVar17;
                bVar25 = false;
              }
              else {
LAB_001b3f53:
                if (uVar17 < 0x11e && uVar17 != 0x100) {
                  uVar23 = (ulong)(uVar17 - 0x101);
                  uVar21 = (ulong)LENGTHBASE[uVar23];
                  if (0xffffffffffffffeb < uVar23 - 0x1c) {
                    uVar17 = LENGTHEXTRA[uVar23];
                    ensureBits25(&local_128,(size_t)in);
                    bVar12 = (byte)uVar17;
                    uVar7 = ~(-1 << (bVar12 & 0x1f)) & local_128.buffer;
                    local_128.buffer = local_128.buffer >> (bVar12 & 0x1f);
                    local_128.bp = local_128.bp + uVar17;
                    uVar21 = uVar21 + uVar7;
                    out = local_f8;
                  }
                  ensureBits32(&local_128,(size_t)in);
                  in = (uchar *)&local_88;
                  uVar17 = huffmanDecodeSymbol(&local_128,(HuffmanTree *)in);
                  if (0x1d < uVar17) {
                    uVar17 = (uint)(uVar17 < 0x20) * 2 + 0x10;
                    goto LAB_001b4131;
                  }
                  uVar7 = DISTANCEBASE[uVar17];
                  if (3 < uVar17) {
                    bVar12 = (byte)DISTANCEEXTRA[uVar17];
                    uVar8 = ~(-1 << (bVar12 & 0x1f)) & local_128.buffer;
                    local_128.buffer = local_128.buffer >> (bVar12 & 0x1f);
                    in = (uchar *)(ulong)local_128.buffer;
                    local_128.bp = local_128.bp + DISTANCEEXTRA[uVar17];
                    uVar7 = uVar7 + uVar8;
                  }
                  uVar23 = out->size;
                  uVar9 = (ulong)uVar7;
                  lVar19 = uVar23 - uVar9;
                  if (uVar23 < uVar9) {
                    uVar17 = 0x34;
                    goto LAB_001b4131;
                  }
                  out->size = uVar23 + uVar21;
                  puVar1 = out->data + uVar23;
                  src = out->data + lVar19;
                  lVar18 = uVar21 - uVar9;
                  if (uVar21 < uVar9 || lVar18 == 0) {
                    lodepng_memcpy(puVar1,src,uVar21);
                  }
                  else {
                    lodepng_memcpy(puVar1,src,uVar9);
                    lVar24 = uVar23 + uVar9;
                    while (bVar25 = lVar18 != 0, lVar18 = lVar18 + -1, bVar25) {
                      puVar1 = local_f8->data + lVar19;
                      lVar19 = lVar19 + 1;
                      local_f8->data[lVar24] = *puVar1;
                      lVar24 = lVar24 + 1;
                    }
                  }
                  bVar25 = false;
                  out = local_f8;
                }
                else {
                  bVar25 = true;
                  if (uVar17 != 0x100) {
                    uVar17 = 0x10;
                    goto LAB_001b4131;
                  }
                }
              }
              in = (uchar *)out->size;
              if (out->allocsize - (long)in < 0x104) {
                in = (uchar *)&((HuffmanTree *)((long)in + 0xf0))->numcodes;
                uVar17 = ucvector_reserve(out,(size_t)in);
                if (uVar17 == 0) {
                  uVar17 = 0x53;
                  goto LAB_001b4131;
                }
              }
              if (local_128.bitsize < local_128.bp) {
                uVar17 = 0x33;
                goto LAB_001b4131;
              }
            } while ((sVar22 == 0) || (out->size <= sVar22));
            uVar17 = 0x6d;
          }
        }
LAB_001b4131:
        HuffmanTree_cleanup(&tree_ll);
        HuffmanTree_cleanup(&local_88);
        if (uVar17 != 0) {
          return uVar17;
        }
      }
      uVar17 = local_fc & 1;
    } while ((local_d0->max_output_size == 0) || (out->size <= local_d0->max_output_size));
    uVar17 = 0x6d;
  }
  else {
    uVar17 = 0x69;
  }
  return uVar17;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(reader.bitsize - reader.bp < 3) return 52; /*error, bit pointer will jump past memory*/
    ensureBits9(&reader, 3);
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE, settings->max_output_size); /*compression, BTYPE 01 or 10*/
    if(!error && settings->max_output_size && out->size > settings->max_output_size) error = 109;
    if(error) break;
  }

  return error;
}